

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O2

char * __thiscall
ctemplate::TemplateDictionary::GetIncludeTemplateName
          (TemplateDictionary *this,TemplateString *variable,int dictnum)

{
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *c;
  char *pcVar1;
  TemplateId v;
  second_type pvVar2;
  char *pcVar3;
  TemplateDictionary *d;
  
  do {
    if (this == (TemplateDictionary *)0x0) {
      __assert_fail("\"Call IsHiddenTemplate before GetIncludeTemplateName\" && 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x3c3,
                    "virtual const char *ctemplate::TemplateDictionary::GetIncludeTemplateName(const TemplateString &, int) const"
                   );
    }
    c = this->include_dict_;
    if (c != (small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              *)0x0) {
      v = TemplateString::GetGlobalId(variable);
      pvVar2 = find_ptr2<ctemplate::small_map<std::map<unsigned_long,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*,std::less<unsigned_long>,ctemplate::ArenaAllocator<std::pair<unsigned_long_const,std::vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>*>,ctemplate::UnsafeArena>>,4,std::equal_to<unsigned_long>,ctemplate::TemplateDictionary::map_arena_init>,unsigned_long>
                         (c,v);
      if (pvVar2 != (second_type)0x0) {
        pcVar1 = (pvVar2->
                 super__Vector_base<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>
                 )._M_impl.super__Vector_impl_data._M_start[dictnum]->filename_;
        pcVar3 = "";
        if (pcVar1 != (char *)0x0) {
          pcVar3 = pcVar1;
        }
        return pcVar3;
      }
    }
    this = this->parent_dict_;
  } while( true );
}

Assistant:

const char *TemplateDictionary::GetIncludeTemplateName(
    const TemplateString& variable, int dictnum) const {
  for (const TemplateDictionary* d = this; d; d = d->parent_dict_) {
    if (d->include_dict_) {
      if (DictVector* it = find_ptr2(*d->include_dict_, variable.GetGlobalId())) {
        TemplateDictionary* dict = (*it)[dictnum];
        return dict->filename_ ? dict->filename_ : "";   // map NULL to ""
      }
    }
  }
  assert("Call IsHiddenTemplate before GetIncludeTemplateName" && 0);
  abort();
}